

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-util.c
# Opt level: O0

void search(player *p)

{
  loc_conflict grid_00;
  loc grid_01;
  loc_conflict grid_02;
  _Bool _Var1;
  object *local_20;
  object *obj;
  loc grid;
  player *p_local;
  
  if ((((p->timed[2] == 0) && (_Var1 = no_light(p), !_Var1)) && (p->timed[4] == 0)) &&
     (p->timed[6] == 0)) {
    for (obj._4_4_ = (p->grid).y + L'\xffffffff'; obj._4_4_ <= (p->grid).y + L'\x01';
        obj._4_4_ = obj._4_4_ + L'\x01') {
      for (obj._0_4_ = (p->grid).x + L'\xffffffff'; (wchar_t)obj <= (p->grid).x + L'\x01';
          obj._0_4_ = (wchar_t)obj + L'\x01') {
        grid_00.y = obj._4_4_;
        grid_00.x = (wchar_t)obj;
        _Var1 = square_issecretdoor((chunk *)cave,grid_00);
        if (_Var1) {
          msg("You have found a secret door.");
          grid_01.y = obj._4_4_;
          grid_01.x = (wchar_t)obj;
          place_closed_door(cave,grid_01);
          disturb(p);
        }
        grid_02.y = obj._4_4_;
        grid_02.x = (wchar_t)obj;
        for (local_20 = square_object((chunk *)cave,grid_02); local_20 != (object *)0x0;
            local_20 = local_20->next) {
          if (((local_20->known != (object *)0x0) && (_Var1 = ignore_item_ok(p,local_20), !_Var1))
             && ((_Var1 = is_trapped_chest(local_20), _Var1 &&
                 (local_20->known->pval != local_20->pval)))) {
            msg("You have discovered a trap on the chest!");
            local_20->known->pval = local_20->pval;
            disturb(p);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void search(struct player *p)
{
	struct loc grid;

	/* Various conditions mean no searching */
	if (p->timed[TMD_BLIND] || no_light(p) ||
		p->timed[TMD_CONFUSED] || p->timed[TMD_IMAGE])
		return;

	/* Search the nearby grids, which are always in bounds */
	for (grid.y = (p->grid.y - 1); grid.y <= (p->grid.y + 1); grid.y++) {
		for (grid.x = (p->grid.x - 1); grid.x <= (p->grid.x + 1); grid.x++) {
			struct object *obj;

			/* Secret doors */
			if (square_issecretdoor(cave, grid)) {
				msg("You have found a secret door.");
				place_closed_door(cave, grid);
				disturb(p);
			}

			/* Traps on chests */
			for (obj = square_object(cave, grid); obj; obj = obj->next) {
				if (!obj->known || ignore_item_ok(p, obj)
						|| !is_trapped_chest(obj)) {
					continue;
				}

				if (obj->known->pval != obj->pval) {
					msg("You have discovered a trap on the chest!");
					obj->known->pval = obj->pval;
					disturb(p);
				}
			}
		}
	}
}